

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O1

word Extra_Truth6MinimumExact(word t,int *pComp,int *pPerm)

{
  int iVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  
  uVar2 = 0xffffffffffffffff;
  lVar5 = 0;
  do {
    lVar8 = 0;
    uVar4 = -lVar5 ^ t;
    do {
      lVar7 = 0;
      uVar6 = uVar4;
      do {
        iVar1 = pComp[lVar7];
        if (5 < (long)iVar1) {
          __assert_fail("v < 6",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                        ,0x8f1,"word Extra_Truth6ChangePhase(word, int)");
        }
        if (uVar6 <= uVar2) {
          uVar2 = uVar6;
        }
        bVar3 = (byte)(1 << ((byte)iVar1 & 0x1f));
        uVar6 = (*(ulong *)(Extra_Truth6ChangePhase_Truth6 + (long)iVar1 * 8) & uVar6) >>
                (bVar3 & 0x3f) |
                (~*(ulong *)(Extra_Truth6ChangePhase_Truth6 + (long)iVar1 * 8) & uVar6) <<
                (bVar3 & 0x3f);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x40);
      if (uVar4 != uVar6) {
        __assert_fail("tTemp2 == tCur",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                      ,0x907,"word Extra_Truth6MinimumExact(word, int *, int *)");
      }
      lVar7 = (long)pPerm[lVar8];
      if (4 < lVar7) {
        __assert_fail("v < 5",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                      ,0x8e3,"word Extra_Truth6SwapAdjacent(word, int)");
      }
      bVar3 = (byte)(1 << ((byte)pPerm[lVar8] & 0x1f));
      uVar4 = (uVar6 & *(ulong *)(Extra_Truth6SwapAdjacent_PMasks + lVar7 * 0x18 + 0x10)) >>
              (bVar3 & 0x3f) |
              (*(ulong *)(Extra_Truth6SwapAdjacent_PMasks + lVar7 * 0x18 + 8) & uVar6) <<
              (bVar3 & 0x3f) | *(ulong *)(Extra_Truth6SwapAdjacent_PMasks + lVar7 * 0x18) & uVar6;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x2d0);
    if ((-lVar5 ^ t) != uVar4) {
      __assert_fail("tTemp1 == tCur",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                    ,0x90a,"word Extra_Truth6MinimumExact(word, int *, int *)");
    }
    bVar9 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar9);
  return uVar2;
}

Assistant:

word Extra_Truth6MinimumExact( word t, int * pComp, int * pPerm )
{
    word tMin = ~(word)0;
    word tCur, tTemp1, tTemp2;
    int i, p, c;
    for ( i = 0; i < 2; i++ )
    {
        tCur = i ? ~t : t;
        tTemp1 = tCur;
        for ( p = 0; p < 720; p++ )
        {
//            printf( "Trying perm %d:\n", p );
//            Kit_DsdPrintFromTruth( &tCur, 6 ), printf( "\n" );;
            tTemp2 = tCur;
            for ( c = 0; c < 64; c++ )
            {
                tMin = Abc_MinWord( tMin, tCur );
                tCur = Extra_Truth6ChangePhase( tCur, pComp[c] );
            }
            assert( tTemp2 == tCur );
            tCur = Extra_Truth6SwapAdjacent( tCur, pPerm[p] );
        }
        assert( tTemp1 == tCur );
    }
    return tMin;
}